

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O1

Class * __thiscall
cppgenerate::Class::addParentClass
          (Class *this,string *parentName,AccessModifier inheritanceType,string *initializer)

{
  Parent p;
  undefined1 local_70 [40];
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  local_70._8_8_ = 0;
  local_70[0x10] = '\0';
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_70._0_8_ = local_70 + 0x10;
  local_48._M_p = (pointer)&local_38;
  std::__cxx11::string::_M_assign((string *)local_70);
  local_70._32_4_ = inheritanceType;
  std::__cxx11::string::_M_assign((string *)&local_48);
  std::vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>::push_back
            (&this->m_parents,(value_type *)local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p);
  }
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_);
  }
  return this;
}

Assistant:

Class& Class::addParentClass( std::string parentName, cppgenerate::AccessModifier inheritanceType, std::string initializer ){
    Parent p;
    p.parentName = parentName;
    p.inheritanceType = inheritanceType;
    p.initializer = initializer;
    m_parents.push_back( p );

    return *this;

}